

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O1

TestStatus *
vkt::pipeline::anon_unknown_0::testRasterSamplesConsistency
          (TestStatus *__return_storage_ptr__,Context *context,GeometryType geometryType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VkSampleCountFlagBits VVar2;
  bool bVar3;
  Context *this;
  deUint32 dVar4;
  InstanceInterface *pIVar5;
  VkPhysicalDevice pVVar6;
  ostream *this_00;
  NotSupportedError *this_01;
  int iVar7;
  ulong uVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  bool bVar11;
  long *local_5c8;
  long local_5c0;
  long local_5b8 [2];
  Context *local_5a8;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  VkPipelineMultisampleStateCreateInfo local_578;
  ostringstream message;
  ChannelType CStack_544;
  ios_base local_4d8 [264];
  MultisampleRenderer renderer;
  Vertex4RGBA vertexData [3];
  
  vertexData[0].position.m_data[0] = -0.75;
  vertexData[0].position.m_data[1] = 0.0;
  vertexData[0].position.m_data[2] = 0.0;
  vertexData[0].position.m_data[3] = 1.0;
  vertexData[0].color.m_data[0] = 1.0;
  vertexData[0].color.m_data[1] = 0.0;
  vertexData[0].color.m_data[2] = 0.0;
  vertexData[0].color.m_data[3] = 1.0;
  vertexData[1].position.m_data[0] = 0.75;
  vertexData[1].position.m_data[1] = 0.125;
  vertexData[1].position.m_data[2] = 0.0;
  vertexData[1].position.m_data[3] = 1.0;
  vertexData[1].color.m_data[0] = 1.0;
  vertexData[1].color.m_data[1] = 0.0;
  vertexData[1].color.m_data[2] = 0.0;
  vertexData[1].color.m_data[3] = 1.0;
  vertexData[2].position.m_data[0] = 0.75;
  vertexData[2].position.m_data[1] = -0.125;
  vertexData[2].position.m_data[2] = 0.0;
  vertexData[2].position.m_data[3] = 1.0;
  vertexData[2].color.m_data[0] = 1.0;
  vertexData[2].color.m_data[1] = 0.0;
  vertexData[2].color.m_data[2] = 0.0;
  vertexData[2].color.m_data[3] = 1.0;
  local_5a8 = context;
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
             &vertices,vertexData,(Vertex4RGBA *)&stack0xffffffffffffffc8,
             (allocator_type *)&renderer);
  paVar1 = &(__return_storage_ptr__->m_description).field_2;
  dVar10 = 2;
  uVar8 = 1;
  bVar11 = false;
  iVar7 = 0;
  do {
    this = local_5a8;
    pIVar5 = Context::getInstanceInterface(local_5a8);
    pVVar6 = Context::getPhysicalDevice(this);
    VVar2 = (&DAT_00ae2750)[uVar8];
    (*pIVar5->_vptr_InstanceInterface[5])(pIVar5,pVVar6,&renderer);
    if (((VkSampleCountFlagBits)
         renderer.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device &
        VVar2) != 0) {
      local_578.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
      local_578.pNext = (void *)0x0;
      local_578.flags = 0;
      local_578.alphaToCoverageEnable = 0;
      local_578.alphaToOneEnable = 0;
      local_578.sampleShadingEnable = 0;
      local_578.minSampleShading = 0.0;
      local_578.pSampleMask = (VkSampleMask *)0x0;
      _message = 0x20;
      CStack_544 = UNSIGNED_INT24;
      local_578.rasterizationSamples = VVar2;
      MultisampleRenderer::MultisampleRenderer
                (&renderer,this,VK_FORMAT_R8G8B8A8_UNORM,(IVec2 *)&message,
                 VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,&vertices,&local_578,
                 (VkPipelineColorBlendAttachmentState *)&DAT_00acdf70);
      MultisampleRenderer::render(&result,&renderer);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&message,
                 result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                 m_data.ptr);
      dVar4 = getUniqueColorsCount((ConstPixelBufferAccess *)&message);
      dVar9 = dVar4;
      if (dVar4 < dVar10) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&message,"More unique colors generated with ",0x22);
        this_00 = (ostream *)std::ostream::operator<<(&message,*(int *)(&UNK_00ae274c + uVar8 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(this_00," than with ",0xb);
        std::ostream::operator<<(this_00,VVar2);
        std::__cxx11::stringbuf::str();
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_5c8,
                   local_5c0 + (long)local_5c8);
        if (local_5c8 != local_5b8) {
          operator_delete(local_5c8,local_5b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
        std::ios_base::~ios_base(local_4d8);
        dVar9 = dVar10;
      }
      de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
                (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                );
      iVar7 = iVar7 + 1;
      MultisampleRenderer::~MultisampleRenderer(&renderer);
      bVar3 = dVar4 < dVar10;
      dVar10 = dVar9;
      if (bVar3) break;
    }
    bVar11 = 5 < uVar8;
    uVar8 = uVar8 + 1;
  } while (uVar8 != 7);
  if (bVar11) {
    if (iVar7 == 0) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      renderer._vptr_MultisampleRenderer = (_func_int **)&renderer.m_colorFormat;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&renderer,"Multisampling is unsupported","");
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)&renderer);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    renderer._vptr_MultisampleRenderer = (_func_int **)&renderer.m_colorFormat;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&renderer,"Number of unique colors increases as the sample count increases"
               ,"");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,renderer._vptr_MultisampleRenderer,
               (long)&(renderer.m_context)->m_testCtx + (long)renderer._vptr_MultisampleRenderer);
    if (renderer._vptr_MultisampleRenderer != (_func_int **)&renderer.m_colorFormat) {
      operator_delete(renderer._vptr_MultisampleRenderer,renderer._16_8_ + 1);
    }
  }
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testRasterSamplesConsistency (Context& context, GeometryType geometryType)
{
	// Use triangle only.
	DE_UNREF(geometryType);

	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_1_BIT,
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT
	};

	const Vertex4RGBA vertexData[3] =
	{
		{
			tcu::Vec4(-0.75f, 0.0f, 0.0f, 1.0f),
			tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
		},
		{
			tcu::Vec4(0.75f, 0.125f, 0.0f, 1.0f),
			tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
		},
		{
			tcu::Vec4(0.75f, -0.125f, 0.0f, 1.0f),
			tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
		}
	};

	const std::vector<Vertex4RGBA>	vertices			(vertexData, vertexData + 3);
	deUint32						prevUniqueColors	= 2;
	int								renderCount			= 0;

	// Do not render with 1 sample (start with samplesNdx = 1).
	for (int samplesNdx = 1; samplesNdx < DE_LENGTH_OF_ARRAY(samples); samplesNdx++)
	{
		if (!isSupportedSampleCount(context.getInstanceInterface(), context.getPhysicalDevice(), samples[samplesNdx]))
			continue;

		const VkPipelineMultisampleStateCreateInfo multisampleStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,													// const void*								pNext;
			0u,															// VkPipelineMultisampleStateCreateFlags	flags;
			samples[samplesNdx],										// VkSampleCountFlagBits					rasterizationSamples;
			false,														// VkBool32									sampleShadingEnable;
			0.0f,														// float									minSampleShading;
			DE_NULL,													// const VkSampleMask*						pSampleMask;
			false,														// VkBool32									alphaToCoverageEnable;
			false														// VkBool32									alphaToOneEnable;
		};

		MultisampleRenderer				renderer		(context, VK_FORMAT_R8G8B8A8_UNORM, tcu::IVec2(32, 32), VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, vertices, multisampleStateParams, getDefaultColorBlendAttachmentState());
		de::MovePtr<tcu::TextureLevel>	result			= renderer.render();
		const deUint32					uniqueColors	= getUniqueColorsCount(result->getAccess());

		renderCount++;

		if (prevUniqueColors > uniqueColors)
		{
			std::ostringstream message;

			message << "More unique colors generated with " << samples[samplesNdx - 1] << " than with " << samples[samplesNdx];
			return tcu::TestStatus::fail(message.str());
		}

		prevUniqueColors = uniqueColors;
	}

	if (renderCount == 0)
		throw tcu::NotSupportedError("Multisampling is unsupported");

	return tcu::TestStatus::pass("Number of unique colors increases as the sample count increases");
}